

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O0

int __thiscall
CombinedH264Demuxer::simpleDemuxBlock
          (CombinedH264Demuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,
          int64_t *discardSize)

{
  int iVar1;
  ReadState RVar2;
  undefined4 extraout_var;
  ulong uVar3;
  size_t sVar4;
  uint8_t *end;
  uint8_t *__src;
  uint8_t *puStack_60;
  int prefixLen;
  uint8_t *nextNal;
  uint8_t *curNal;
  uint8_t *dataEnd;
  uint8_t *data;
  int local_38;
  uint uStack_34;
  bool isFirstBlock;
  int readRez;
  uint32_t readedBytes;
  int64_t *discardSize_local;
  PIDSet *acceptedPIDs_local;
  DemuxedData *demuxedData_local;
  CombinedH264Demuxer *this_local;
  
  _readRez = discardSize;
  discardSize_local = (int64_t *)acceptedPIDs;
  acceptedPIDs_local = (PIDSet *)demuxedData;
  demuxedData_local = (DemuxedData *)this;
  if (((this->super_CombinedH264Reader).m_firstDemuxCall & 1U) != 0) {
    CombinedH264Reader::fillPids(&this->super_CombinedH264Reader,acceptedPIDs,0);
    (this->super_CombinedH264Reader).m_firstDemuxCall = false;
  }
  *_readRez = 0;
  local_38 = 0;
  data._7_1_ = 0;
  iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&stack0xffffffffffffffcc,
                     &local_38,(long)&data + 7);
  if (local_38 == 2) {
    this->m_lastReadRez = 2;
    this_local._4_4_ = 2;
  }
  else {
    uVar3 = (ulong)uStack_34;
    sVar4 = MemoryBlock::size(&(this->super_CombinedH264Reader).m_tmpBuffer);
    if ((uVar3 + sVar4 == 0) || ((uStack_34 == 0 && (this->m_lastReadRez == 1)))) {
      this->m_lastReadRez = local_38;
      this_local._4_4_ = 1;
    }
    else {
      if (uStack_34 != 0) {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)uStack_34);
      }
      this->m_lastReadRez = local_38;
      dataEnd = (uint8_t *)(CONCAT44(extraout_var,iVar1) + 0x80);
      end = dataEnd + uStack_34;
      sVar4 = MemoryBlock::size(&(this->super_CombinedH264Reader).m_tmpBuffer);
      if (sVar4 != 0) {
        sVar4 = MemoryBlock::size(&(this->super_CombinedH264Reader).m_tmpBuffer);
        dataEnd = dataEnd + -sVar4;
        __src = MemoryBlock::data(&(this->super_CombinedH264Reader).m_tmpBuffer);
        sVar4 = MemoryBlock::size(&(this->super_CombinedH264Reader).m_tmpBuffer);
        memcpy(dataEnd,__src,sVar4);
        MemoryBlock::clear(&(this->super_CombinedH264Reader).m_tmpBuffer);
      }
      nextNal = dataEnd;
      puStack_60 = NALUnit::findNALWithStartCode(dataEnd + 3,end,true);
      while (nextNal < end + -4) {
        iVar1 = CombinedH264Reader::getPrefixLen(nextNal,end);
        if (iVar1 != 0) {
          RVar2 = CombinedH264Reader::detectStreamByNal
                            (&this->super_CombinedH264Reader,nextNal + iVar1,puStack_60);
          (this->super_CombinedH264Reader).m_state = RVar2;
          if ((this->super_CombinedH264Reader).m_state == NeedMoreData) {
            if ((long)end - (long)nextNal < 0x80) {
              MemoryBlock::append(&(this->super_CombinedH264Reader).m_tmpBuffer,nextNal,
                                  (long)end - (long)nextNal);
              return 0;
            }
            (this->super_CombinedH264Reader).m_state = Primary;
          }
        }
        if ((this->super_CombinedH264Reader).m_state == Both) {
          CombinedH264Reader::addDataToPrimary
                    (&this->super_CombinedH264Reader,nextNal,puStack_60,
                     (DemuxedData *)acceptedPIDs_local,_readRez);
          CombinedH264Reader::addDataToSecondary
                    (&this->super_CombinedH264Reader,nextNal,puStack_60,
                     (DemuxedData *)acceptedPIDs_local,_readRez);
        }
        else if ((this->super_CombinedH264Reader).m_state == Primary) {
          CombinedH264Reader::addDataToPrimary
                    (&this->super_CombinedH264Reader,nextNal,puStack_60,
                     (DemuxedData *)acceptedPIDs_local,_readRez);
        }
        else {
          CombinedH264Reader::addDataToSecondary
                    (&this->super_CombinedH264Reader,nextNal,puStack_60,
                     (DemuxedData *)acceptedPIDs_local,_readRez);
        }
        nextNal = puStack_60;
        puStack_60 = NALUnit::findNALWithStartCode(puStack_60 + 3,end,true);
      }
      if (nextNal < end) {
        if (this->m_lastReadRez == 1) {
          if ((this->super_CombinedH264Reader).m_state == Primary) {
            CombinedH264Reader::addDataToPrimary
                      (&this->super_CombinedH264Reader,nextNal,end,(DemuxedData *)acceptedPIDs_local
                       ,_readRez);
          }
          else {
            CombinedH264Reader::addDataToSecondary
                      (&this->super_CombinedH264Reader,nextNal,end,(DemuxedData *)acceptedPIDs_local
                       ,_readRez);
          }
        }
        else {
          MemoryBlock::append(&(this->super_CombinedH264Reader).m_tmpBuffer,nextNal,
                              (long)end - (long)nextNal);
        }
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int CombinedH264Demuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    if (m_firstDemuxCall)
    {
        fillPids(acceptedPIDs, 0);
        m_firstDemuxCall = false;
    }

    discardSize = 0;

    uint32_t readedBytes;
    int readRez = 0;
    bool isFirstBlock = false;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez, &isFirstBlock);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }

    if (readedBytes + m_tmpBuffer.size() == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);
    m_lastReadRez = readRez;
    data += MAX_TMP_BUFFER_SIZE;
    uint8_t* dataEnd = data + readedBytes;
    if (m_tmpBuffer.size() > 0)
    {
        data -= m_tmpBuffer.size();
        memcpy(data, m_tmpBuffer.data(), m_tmpBuffer.size());
        m_tmpBuffer.clear();
    }
    uint8_t* curNal = data;

    uint8_t* nextNal = NALUnit::findNALWithStartCode(curNal + 3, dataEnd, true);
    while (curNal < dataEnd - 4)
    {
        const int prefixLen = getPrefixLen(curNal, dataEnd);
        if (prefixLen != 0)
        {
            m_state = detectStreamByNal(curNal + prefixLen, nextNal);
            if (m_state == ReadState::NeedMoreData)
            {
                if (dataEnd - curNal < MAX_TMP_BUFFER_SIZE)
                {
                    m_tmpBuffer.append(curNal, dataEnd - curNal);
                    return 0;
                }
                // some error in a stream, just ignore
                m_state = ReadState::Primary;
            }
        }
        if (m_state == ReadState::Both)
        {
            addDataToPrimary(curNal, nextNal, demuxedData, discardSize);
            addDataToSecondary(curNal, nextNal, demuxedData, discardSize);
        }
        else if (m_state == ReadState::Primary)
            addDataToPrimary(curNal, nextNal, demuxedData, discardSize);
        else
            addDataToSecondary(curNal, nextNal, demuxedData, discardSize);
        curNal = nextNal;
        nextNal = NALUnit::findNALWithStartCode(curNal + 3, dataEnd, true);
    }

    if (curNal < dataEnd)
    {
        if (m_lastReadRez == BufferedReader::DATA_EOF)
        {
            if (m_state == ReadState::Primary)
                addDataToPrimary(curNal, dataEnd, demuxedData, discardSize);
            else
                addDataToSecondary(curNal, dataEnd, demuxedData, discardSize);
        }
        else
        {
            m_tmpBuffer.append(curNal, dataEnd - curNal);
        }
    }

    return 0;
}